

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O3

Proto * luaU_undump(lua_State *L,ZIO *Z,Mbuffer *buff,char *name)

{
  char cVar1;
  TString *p;
  Proto *pPVar2;
  char s [12];
  long local_44;
  int local_3c;
  LoadState local_38;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_38.L = L;
  local_38.Z = Z;
  local_38.b = buff;
  local_38.name = name;
  LoadBlock(&local_38,&local_44,0xc);
  if (local_3c != 0x80408 || local_44 != 0x401005161754c1b) {
    luaO_pushfstring(L,"%s: %s in precompiled chunk",name,"bad header");
    luaD_throw(L,3);
  }
  p = luaS_newlstr(L,"=?",2);
  pPVar2 = LoadFunction(&local_38,p);
  return pPVar2;
}

Assistant:

Proto* luaU_undump (lua_State* L, ZIO* Z, Mbuffer* buff, const char* name)
{
 LoadState S;
 if (*name=='@' || *name=='=')
  S.name=name+1;
 else if (*name==LUA_SIGNATURE[0])
  S.name="binary string";
 else
  S.name=name;
 S.L=L;
 S.Z=Z;
 S.b=buff;
 LoadHeader(&S);
 return LoadFunction(&S,luaS_newliteral(L,"=?"));
}